

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::PCVScanner::create(PCVScanner *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  long in_RSI;
  
  p_Var1 = *(_func_int **)(in_RSI + 0x140);
  pp_Var3 = (_func_int **)operator_new(0x148);
  pp_Var3[1] = (_func_int *)0x0;
  pp_Var3[2] = (_func_int *)(pp_Var3 + 4);
  pp_Var3[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 4) = 0;
  *(undefined1 *)(pp_Var3 + 10) = 0;
  pp_Var3[0xb] = (_func_int *)0x0;
  pp_Var3[0xc] = (_func_int *)0x0;
  pp_Var3[0x21] = (_func_int *)0x0;
  pp_Var3[0x22] = (_func_int *)0x0;
  pp_Var3[0x23] = (_func_int *)0x0;
  pp_Var3[0x24] = (_func_int *)0x0;
  pp_Var3[0x25] = (_func_int *)0x0;
  p_Var2 = *(_func_int **)(in_RSI + 0x138);
  pp_Var3[0x26] = *(_func_int **)(in_RSI + 0x130);
  pp_Var3[0x27] = p_Var2;
  *pp_Var3 = (_func_int *)&PTR__WalkerPass_01071d00;
  pp_Var3[0x28] = p_Var1;
  (this->super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>)
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
  .super_Pass._vptr_Pass = pp_Var3;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<PCVScanner>(
      functionNewInfos, functionSetGetInfos, functionCopyInfos);
  }